

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::_Rb_tree_const_iterator<Node<Read>_>_>::copyAppend
          (QGenericArrayOps<std::_Rb_tree_const_iterator<Node<Read>_>_> *this,
          _Rb_tree_const_iterator<Node<Read>_> *b,_Rb_tree_const_iterator<Node<Read>_> *e)

{
  _Rb_tree_const_iterator<Node<Read>_> *p_Var1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  _Rb_tree_const_iterator<Node<Read>_> *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    p_Var1 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>::begin
                       ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)0x13bb87);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      p_Var1[*(long *)(in_RDI + 0x10)]._M_node = (_Base_ptr)*local_10;
      local_10 = local_10 + 1;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }